

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.h
# Opt level: O1

void __thiscall
CompareTxMemPoolEntryByAncestorFee::GetModFeeAndSize<CTxMemPoolEntry>
          (CompareTxMemPoolEntryByAncestorFee *this,CTxMemPoolEntry *a,double *mod_fee,double *size)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int64_t iVar5;
  long in_FS_OFFSET;
  double dVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = a->m_modified_fee;
  lVar3 = a->nSizeWithAncestors;
  lVar4 = a->nModFeesWithAncestors;
  iVar5 = GetVirtualTransactionSize((long)a->nTxWeight,a->sigOpCost,nBytesPerSigOp);
  if ((double)lVar3 * (double)lVar2 <= (double)(int)iVar5 * (double)lVar4) {
    *mod_fee = (double)a->m_modified_fee;
    iVar5 = GetVirtualTransactionSize((long)a->nTxWeight,a->sigOpCost,nBytesPerSigOp);
    dVar6 = (double)(int)iVar5;
  }
  else {
    *mod_fee = (double)a->nModFeesWithAncestors;
    dVar6 = (double)a->nSizeWithAncestors;
  }
  *size = dVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void GetModFeeAndSize(const T &a, double &mod_fee, double &size) const
    {
        // Compare feerate with ancestors to feerate of the transaction, and
        // return the fee/size for the min.
        double f1 = (double)a.GetModifiedFee() * a.GetSizeWithAncestors();
        double f2 = (double)a.GetModFeesWithAncestors() * a.GetTxSize();

        if (f1 > f2) {
            mod_fee = a.GetModFeesWithAncestors();
            size = a.GetSizeWithAncestors();
        } else {
            mod_fee = a.GetModifiedFee();
            size = a.GetTxSize();
        }
    }